

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.h
# Opt level: O2

void __thiscall FIX::Group::Group(Group *this,int field,int delim)

{
  message_order local_40;
  
  FIX::message_order::message_order(&local_40,delim,0);
  FIX::FieldMap::FieldMap(&this->super_FieldMap,&local_40);
  shared_array<int>::~shared_array(&local_40.m_groupOrder);
  *(undefined ***)this = &PTR__FieldMap_002f8088;
  this->m_field = field;
  this->m_delim = delim;
  return;
}

Assistant:

Group(int field, int delim)
      : FieldMap(message_order(delim, 0)),
        m_field(field),
        m_delim(delim) {}